

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
absl::lts_20240722::container_internal::
btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>,_256,_false>_>
::clear(btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>,_256,_false>_>
        *this)

{
  bool bVar1;
  node_type *pnVar2;
  allocator_type *alloc;
  node_type **ppnVar3;
  btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>,_256,_false>_>
  *this_local;
  
  bVar1 = empty(this);
  if (!bVar1) {
    pnVar2 = root(this);
    alloc = mutable_allocator(this);
    btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>,_256,_false>_>
    ::clear_and_delete(pnVar2,alloc);
  }
  pnVar2 = EmptyNode();
  ppnVar3 = mutable_rightmost(this);
  *ppnVar3 = pnVar2;
  ppnVar3 = mutable_root(this);
  *ppnVar3 = pnVar2;
  this->size_ = 0;
  return;
}

Assistant:

void btree<P>::clear() {
  if (!empty()) {
    node_type::clear_and_delete(root(), mutable_allocator());
  }
  mutable_root() = mutable_rightmost() = EmptyNode();
  size_ = 0;
}